

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O1

_Bool adt_str_equal_cstr(adt_str_t *self,char *cstr)

{
  bool bVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  
  if (cstr != (char *)0x0 && self != (adt_str_t *)0x0) {
    if ((*cstr == '\0') && (self->s32Cur == 0)) {
      return true;
    }
    if ((0 < (long)self->s32Cur) && (puVar3 = self->pAlloc, puVar3 != (uint8_t *)0x0)) {
      puVar2 = puVar3 + self->s32Cur;
      do {
        if (puVar2 <= puVar3) break;
        bVar1 = *cstr != '\0' && *puVar3 == *cstr;
        puVar3 = puVar3 + bVar1;
        cstr = (char *)((uint8_t *)cstr + bVar1);
      } while (bVar1);
      if ((*cstr == '\0') && (puVar3 == puVar2)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool adt_str_equal_cstr(const adt_str_t *self, const char *cstr)
{
   if ( (self != 0) && (cstr != 0))
   {
      if ( (*cstr == 0) && (self->s32Cur == 0) )
      {
         return true;
      }
      else if (self->s32Cur > 0 && self->pAlloc != 0)
      {
         const uint8_t *pStr = (const uint8_t*) cstr;
         const uint8_t *pNext = self->pAlloc;
         const uint8_t *pEnd = self->pAlloc + self->s32Cur;
         while(pNext < pEnd)
         {
            uint8_t c = *pNext;
            uint8_t d = *pStr;
            if ( (c != d) || (d == 0) )
            {
               break;
            }
            ++pNext;
            ++pStr;
         }
         if ( (*pStr == 0) && (pNext == pEnd) )
         {
            return true;
         }
      }
   }
   return false;
}